

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall Message::EnqueueMessage(Message *this,char *msg)

{
  char (*pacVar1) [20];
  int iVar2;
  size_t __n;
  
  sem_wait((sem_t *)&this->_full);
  sem_wait((sem_t *)this);
  iVar2 = this->_current;
  this->_current = iVar2 + 1;
  pacVar1 = this->_messages + (long)iVar2 + 1;
  *(char *)((long)pacVar1 + 0) = '\0';
  *(char *)((long)pacVar1 + 1) = '\0';
  *(char *)((long)pacVar1 + 2) = '\0';
  *(char *)((long)pacVar1 + 3) = '\0';
  *(char *)((long)pacVar1 + 4) = '\0';
  *(char *)((long)pacVar1 + 5) = '\0';
  *(char *)((long)pacVar1 + 6) = '\0';
  *(char *)((long)pacVar1 + 7) = '\0';
  *(char *)((long)pacVar1 + 8) = '\0';
  *(char *)((long)pacVar1 + 9) = '\0';
  *(char *)((long)pacVar1 + 10) = '\0';
  *(char *)((long)pacVar1 + 0xb) = '\0';
  *(char *)((long)pacVar1 + 0xc) = '\0';
  *(char *)((long)pacVar1 + 0xd) = '\0';
  *(char *)((long)pacVar1 + 0xe) = '\0';
  *(char *)((long)pacVar1 + 0xf) = '\0';
  pacVar1 = this->_messages + (long)iVar2 + 1;
  *(char *)((long)pacVar1 + 0x10) = '\0';
  *(char *)((long)pacVar1 + 0x11) = '\0';
  *(char *)((long)pacVar1 + 0x12) = '\0';
  *(char *)((long)pacVar1 + 0x13) = '\0';
  iVar2 = this->_current;
  __n = strlen(msg);
  memcpy(this->_messages + iVar2,msg,__n);
  sem_post((sem_t *)this);
  sem_post((sem_t *)&this->_empty);
  return;
}

Assistant:

void Message::EnqueueMessage(const char *msg)
{
    sem_wait(&_full);
    sem_wait(&_lock);
    _current += 1;
    bzero(&_messages[_current], MaxMessageSize*sizeof(char));
    memcpy(&_messages[_current], msg, strlen(msg)*sizeof(char));
    sem_post(&_lock);
    sem_post(&_empty);
}